

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O3

int bmp_read_direct(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  uint y;
  short sVar1;
  int iVar2;
  long lVar3;
  short sVar4;
  int iVar5;
  uint *result;
  int iVar6;
  short data;
  int blue;
  int green;
  int red;
  int alpha;
  ushort local_52;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  gdImagePtr local_38;
  
  local_3c = 0;
  local_48 = 0;
  local_4c = 0;
  local_50 = 0;
  local_52 = 0;
  iVar6 = info->enctype;
  if (iVar6 == 0) {
LAB_00112762:
    local_38 = im;
    lVar3 = gdTell(infile);
    if (lVar3 != header->off) {
      gdSeek(infile,header->off);
    }
    iVar6 = info->height;
    sVar1 = (short)*(undefined4 *)&info->depth;
    sVar4 = sVar1 + 7;
    if (-1 < sVar1) {
      sVar4 = sVar1;
    }
    if (iVar6 < 1) {
      iVar2 = 0;
    }
    else {
      iVar5 = (((int)sVar4 >> 3) * info->width) % 4;
      local_44 = 5 - iVar5;
      local_40 = 0;
      do {
        y = ~local_40 + iVar6;
        if (info->topdown != '\0') {
          y = local_40;
        }
        if (0 < info->width) {
          iVar6 = 0;
          do {
            if (info->depth == 0x18) {
              iVar2 = gdGetByte(&local_50,infile);
              if ((iVar2 == 0) ||
                 (iVar2 = gdGetByte((int *)&local_4c,infile), result = &local_48, iVar2 == 0))
              goto LAB_0011290d;
LAB_0011289a:
              iVar2 = gdGetByte((int *)result,infile);
              if (iVar2 == 0) goto LAB_0011290d;
            }
            else {
              if (info->depth != 0x10) {
                iVar2 = gdGetByte(&local_50,infile);
                if (((iVar2 != 0) && (iVar2 = gdGetByte((int *)&local_4c,infile), iVar2 != 0)) &&
                   (iVar2 = gdGetByte((int *)&local_48,infile), iVar2 != 0)) {
                  result = &local_3c;
                  goto LAB_0011289a;
                }
                goto LAB_0011290d;
              }
              iVar2 = gdGetWordLSB((short *)&local_52,infile);
              if (iVar2 == 0) goto LAB_0011290d;
              local_48 = local_52 >> 7 & 0xf8;
              local_4c = local_52 >> 2 & 0xf8;
              local_50 = (local_52 & 0x1f) << 3;
            }
            gdImageSetPixel(local_38,iVar6,y,local_4c * 0x100 + local_48 * 0x10000 + local_50);
            iVar6 = iVar6 + 1;
          } while (iVar6 < info->width);
        }
        iVar6 = local_44;
        if (iVar5 != 0) {
          do {
            iVar2 = gdGetByte((int *)&local_48,infile);
            if (iVar2 == 0) goto LAB_0011290d;
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
        }
        local_40 = local_40 + 1;
        iVar6 = info->height;
        iVar2 = 0;
      } while ((int)local_40 < iVar6);
    }
  }
  else {
    if (iVar6 == 2) {
      if (info->depth == 4) goto LAB_00112762;
    }
    else if ((iVar6 == 1) && (info->depth == 8)) goto LAB_00112762;
LAB_0011290d:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int bmp_read_direct(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0;
	int padding = 0, alpha = 0, red = 0, green = 0, blue = 0;
	signed short int data = 0;

	switch(info->enctype) {
	case BMP_BI_RGB:
		/* no-op */
		break;

	case BMP_BI_BITFIELDS:
		if (info->depth == 24) {
			BMP_DEBUG(printf("Bitfield compression isn't supported for 24-bit\n"));
			return 1;
		}
		BMP_DEBUG(printf("Currently no bitfield support\n"));
		return 1;
		break;

	case BMP_BI_RLE8:
		if (info->depth != 8) {
			BMP_DEBUG(printf("RLE is only valid for 8-bit images\n"));
			return 1;
		}
		break;
	case BMP_BI_RLE4:
		if (info->depth != 4) {
			BMP_DEBUG(printf("RLE is only valid for 4-bit images\n"));
			return 1;
		}
		break;
	case BMP_BI_JPEG:
	case BMP_BI_PNG:
	default:
		BMP_DEBUG(printf("Unsupported BMP compression format\n"));
		return 1;
	}

	/* There is a chance the data isn't until later, would be wierd but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		gdSeek(infile, header->off);
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = ((int)(info->depth / 8) * info->width) % 4;
	if (padding) {
		padding = 4 - padding;
	}


	for (ypos = 0; ypos < info->height; ++ypos) {
		if (info->topdown) {
			row = ypos;
		} else {
			row = info->height - ypos - 1;
		}

		for (xpos = 0; xpos < info->width; xpos++) {
			if (info->depth == 16) {
				if (!gdGetWordLSB(&data, infile)) {
					return 1;
				}
				BMP_DEBUG(printf("Data: %X\n", data));
				red = ((data & 0x7C00) >> 10) << 3;
				green = ((data & 0x3E0) >> 5) << 3;
				blue = (data & 0x1F) << 3;
				BMP_DEBUG(printf("R: %d, G: %d, B: %d\n", red, green, blue));
			} else if (info->depth == 24) {
				if (!gdGetByte(&blue, infile) || !gdGetByte(&green, infile) || !gdGetByte(&red, infile)) {
					return 1;
				}
			} else {
				if (!gdGetByte(&blue, infile) || !gdGetByte(&green, infile) || !gdGetByte(&red, infile) || !gdGetByte(&alpha, infile)) {
					return 1;
				}
			}
			/*alpha = gdAlphaMax - (alpha >> 1);*/
			gdImageSetPixel(im, xpos, row, gdTrueColor(red, green, blue));
		}
		for (xpos = padding; xpos > 0; --xpos) {
			if (!gdGetByte(&red, infile)) {
				return 1;
			}
		}
	}

	return 0;
}